

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

void * add_deviceid_option(pcp_flow_t *f,void *cur)

{
  uint16_t uVar1;
  pcp_deviceid_option_t *deviceid_op;
  void *cur_local;
  pcp_flow_t *f_local;
  
  *(undefined1 *)cur = 0x60;
  uVar1 = htons(0x20);
  *(uint16_t *)((long)cur + 2) = uVar1;
  *(undefined8 *)((long)cur + 4) = *(undefined8 *)(f->f_deviceid).deviceid;
  *(undefined8 *)((long)cur + 0xc) = *(undefined8 *)((f->f_deviceid).deviceid + 8);
  *(undefined8 *)((long)cur + 0x14) = *(undefined8 *)((f->f_deviceid).deviceid + 0x10);
  *(undefined8 *)((long)cur + 0x1c) = *(undefined8 *)((f->f_deviceid).deviceid + 0x18);
  return (void *)((long)cur + 0x24);
}

Assistant:

static void *add_deviceid_option(pcp_flow_t *f, void *cur) {
    pcp_deviceid_option_t *deviceid_op = (pcp_deviceid_option_t *)cur;

    deviceid_op->option = PCP_OPTION_DEVICEID;
    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);
    deviceid_op->len =
        htons(sizeof(pcp_deviceid_option_t) - sizeof(pcp_options_hdr_t));
    memcpy(&(deviceid_op->deviceid[0]), &(f->f_deviceid.deviceid[0]),
           MAX_DEVICE_ID);
    cur = deviceid_op + 1;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return cur;
}